

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_pathmatch.c
# Opt level: O0

wchar_t pm_list_w(wchar_t *start,wchar_t *end,wchar_t c,wchar_t flags)

{
  wchar_t *pwVar1;
  wchar_t local_44;
  wchar_t local_40;
  wchar_t rangeEnd;
  wchar_t nomatch;
  wchar_t match;
  wchar_t nextRangeStart;
  wchar_t rangeStart;
  wchar_t *p;
  wchar_t flags_local;
  wchar_t c_local;
  wchar_t *end_local;
  wchar_t *start_local;
  
  match = L'\0';
  rangeEnd = L'\x01';
  local_40 = L'\0';
  _nextRangeStart = start;
  if (((*start == L'!') || (*start == L'^')) && (start < end)) {
    rangeEnd = L'\0';
    local_40 = L'\x01';
    _nextRangeStart = start + 1;
  }
  do {
    if (end <= _nextRangeStart) {
      return local_40;
    }
    nomatch = L'\0';
    if (*_nextRangeStart == L'-') {
      if ((match == L'\0') || (_nextRangeStart == end + -1)) {
        if (*_nextRangeStart == c) {
          return rangeEnd;
        }
      }
      else {
        local_44 = _nextRangeStart[1];
        pwVar1 = _nextRangeStart + 1;
        if (local_44 == L'\\') {
          local_44 = _nextRangeStart[2];
          pwVar1 = _nextRangeStart + 2;
        }
        _nextRangeStart = pwVar1;
        if ((match <= c) && (c <= local_44)) {
          return rangeEnd;
        }
      }
    }
    else {
      if (*_nextRangeStart == L'\\') {
        _nextRangeStart = _nextRangeStart + 1;
      }
      if (*_nextRangeStart == c) {
        return rangeEnd;
      }
      nomatch = *_nextRangeStart;
    }
    match = nomatch;
    _nextRangeStart = _nextRangeStart + 1;
  } while( true );
}

Assistant:

static int
pm_list_w(const wchar_t *start, const wchar_t *end, const wchar_t c, int flags)
{
	const wchar_t *p = start;
	wchar_t rangeStart = L'\0', nextRangeStart;
	int match = 1, nomatch = 0;

	/* This will be used soon... */
	(void)flags; /* UNUSED */

	/* If this is a negated class, return success for nomatch. */
	if ((*p == L'!' || *p == L'^') && p < end) {
		match = 0;
		nomatch = 1;
		++p;
	}

	while (p < end) {
		nextRangeStart = L'\0';
		switch (*p) {
		case L'-':
			/* Trailing or initial '-' is not special. */
			if ((rangeStart == L'\0') || (p == end - 1)) {
				if (*p == c)
					return (match);
			} else {
				wchar_t rangeEnd = *++p;
				if (rangeEnd == L'\\')
					rangeEnd = *++p;
				if ((rangeStart <= c) && (c <= rangeEnd))
					return (match);
			}
			break;
		case L'\\':
			++p;
			/* Fall through */
		default:
			if (*p == c)
				return (match);
			nextRangeStart = *p; /* Possible start of range. */
		}
		rangeStart = nextRangeStart;
		++p;
	}
	return (nomatch);
}